

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionContext.cxx
# Opt level: O2

void __thiscall
cmGeneratorExpressionContext::cmGeneratorExpressionContext
          (cmGeneratorExpressionContext *this,cmLocalGenerator *lg,string *config,bool quiet,
          cmGeneratorTarget *headTarget,cmGeneratorTarget *currentTarget,bool evaluateForBuildsystem
          ,cmListFileBacktrace *backtrace,string *language)

{
  _Rb_tree_header *p_Var1;
  
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,backtrace);
  p_Var1 = &(this->DependTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->DependTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DependTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->DependTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->DependTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->DependTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->AllTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->AllTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->AllTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->AllTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->AllTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->AllTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header;
  (this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header;
  (this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->LG = lg;
  std::__cxx11::string::string((string *)&this->Config,(string *)config);
  std::__cxx11::string::string((string *)&this->Language,(string *)language);
  this->HeadTarget = headTarget;
  this->CurrentTarget = currentTarget;
  this->Quiet = quiet;
  this->HadError = false;
  this->HadContextSensitiveCondition = false;
  this->HadHeadSensitiveCondition = false;
  this->EvaluateForBuildsystem = evaluateForBuildsystem;
  return;
}

Assistant:

cmGeneratorExpressionContext::cmGeneratorExpressionContext(
  cmLocalGenerator* lg, std::string const& config, bool quiet,
  cmGeneratorTarget const* headTarget, const cmGeneratorTarget* currentTarget,
  bool evaluateForBuildsystem, cmListFileBacktrace const& backtrace,
  std::string const& language)
  : Backtrace(backtrace)
  , LG(lg)
  , Config(config)
  , Language(language)
  , HeadTarget(headTarget)
  , CurrentTarget(currentTarget)
  , Quiet(quiet)
  , HadError(false)
  , HadContextSensitiveCondition(false)
  , HadHeadSensitiveCondition(false)
  , EvaluateForBuildsystem(evaluateForBuildsystem)
{
}